

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindUnsupportedExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ParsedExpression *expr,
          idx_t depth,string *message)

{
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  idx_t depth_local;
  ErrorData result;
  ErrorData local_a8;
  
  depth_local = depth;
  ErrorData::ErrorData(&result);
  local_148 = (code *)0x0;
  pcStack_140 = (code *)0x0;
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_158._M_unused._M_object = operator_new(0x18);
  *(ExpressionBinder **)local_158._M_unused._0_8_ = this;
  *(idx_t **)((long)local_158._M_unused._0_8_ + 8) = &depth_local;
  *(ErrorData **)((long)local_158._M_unused._0_8_ + 0x10) = &result;
  pcStack_140 = ::std::
                _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression_binder.cpp:386:12)>
                ::_M_invoke;
  local_148 = ::std::
              _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/planner/expression_binder.cpp:386:12)>
              ::_M_manager;
  ParsedExpressionIterator::EnumerateChildren
            (expr,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                   *)&local_158);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_158);
  if (result.initialized == true) {
    ErrorData::ErrorData(&local_a8,&result);
    BindResult::BindResult(__return_storage_ptr__,&local_a8);
    ErrorData::~ErrorData(&local_a8);
  }
  else {
    BinderException::Unsupported((BinderException *)&local_158,expr,message);
    BindResult::BindResult(__return_storage_ptr__,(Exception *)&local_158);
    ::std::runtime_error::~runtime_error((runtime_error *)local_158._M_pod_data);
  }
  ErrorData::~ErrorData(&result);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindUnsupportedExpression(ParsedExpression &expr, idx_t depth, const string &message) {
	// we always prefer to throw an error if it occurs in a child expression
	// since that error might be more descriptive
	// bind all children
	ErrorData result;
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](unique_ptr<ParsedExpression> &child) { BindChild(child, depth, result); });
	if (result.HasError()) {
		return BindResult(std::move(result));
	}
	return BindResult(BinderException::Unsupported(expr, message));
}